

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rattle.cpp
# Opt level: O1

void __thiscall OpenMD::Rattle::Rattle(Rattle *this,SimInfo *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Globals *pGVar2;
  SimInfo *pSVar3;
  pointer pcVar4;
  Parameter<double> *pPVar5;
  long *plVar6;
  ConstraintWriter *this_00;
  size_type *psVar7;
  string local_90;
  string local_70;
  string local_50;
  
  this->info_ = info;
  this->maxConsIteration_ = 10;
  this->consTolerance_ = 1e-06;
  this->currentSnapshot_ = (Snapshot *)0x0;
  this->doRattle_ = false;
  (this->constraintOutputFile_)._M_dataplus._M_p = (pointer)&(this->constraintOutputFile_).field_2;
  (this->constraintOutputFile_)._M_string_length = 0;
  (this->constraintOutputFile_).field_2._M_local_buf[0] = '\0';
  this->constraintWriter_ = (ConstraintWriter *)0x0;
  this->currConstraintTime_ = 0.0;
  if (info->hasNGlobalConstraints_ == false) {
    SimInfo::calcNConstraints(info);
  }
  if (info->nGlobalConstraints_ != 0) {
    this->doRattle_ = true;
  }
  if (this->doRattle_ == true) {
    pGVar2 = this->info_->simParams_;
    if ((pGVar2->Dt).super_ParameterBase.empty_ == false) {
      this->dt_ = (pGVar2->Dt).data_;
    }
    else {
      builtin_strncpy(painCave.errMsg + 0x10," is not set\n",0xd);
      builtin_strncpy(painCave.errMsg,"Rattle Error: dt",0x10);
      painCave.isFatal = 1;
      simError();
    }
    pSVar3 = this->info_;
    this->currentSnapshot_ = pSVar3->sman_->currentSnapshot_;
    pPVar5 = &pGVar2->ConstraintTime;
    if ((pGVar2->ConstraintTime).super_ParameterBase.empty_ != false) {
      pPVar5 = &pGVar2->StatusTime;
    }
    this->constraintTime_ = pPVar5->data_;
    pcVar4 = (pSVar3->finalConfigFileName_)._M_dataplus._M_p;
    local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_70,pcVar4,pcVar4 + (pSVar3->finalConfigFileName_)._M_string_length);
    getPrefix(&local_50,&local_70);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_50);
    paVar1 = &local_90.field_2;
    psVar7 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar7) {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90.field_2._8_8_ = plVar6[3];
      local_90._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_90.field_2._M_allocated_capacity = *psVar7;
      local_90._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_90._M_string_length = plVar6[1];
    *plVar6 = (long)psVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->constraintOutputFile_,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    this_00 = (ConstraintWriter *)operator_new(0x208);
    pSVar3 = this->info_;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_90,(this->constraintOutputFile_)._M_dataplus._M_p,
               (allocator<char> *)&local_50);
    ConstraintWriter::ConstraintWriter(this_00,pSVar3,&local_90);
    this->constraintWriter_ = this_00;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != paVar1) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if (this->constraintWriter_ == (ConstraintWriter *)0x0) {
      builtin_strncpy(painCave.errMsg,"Failed to create ConstraintWriter\n",0x23);
      painCave.isFatal = 1;
      simError();
    }
  }
  return;
}

Assistant:

Rattle::Rattle(SimInfo* info) :
      info_(info), maxConsIteration_(10), consTolerance_(1.0e-6),
      doRattle_(false), currConstraintTime_(0.0) {
    if (info_->getNGlobalConstraints() > 0) doRattle_ = true;

    if (!doRattle_) return;

    Globals* simParams = info_->getSimParams();

    if (simParams->haveDt()) {
      dt_ = simParams->getDt();
    } else {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Rattle Error: dt is not set\n");
      painCave.isFatal = 1;
      simError();
    }

    currentSnapshot_ = info_->getSnapshotManager()->getCurrentSnapshot();
    if (simParams->haveConstraintTime()) {
      constraintTime_ = simParams->getConstraintTime();
    } else {
      constraintTime_ = simParams->getStatusTime();
    }

    constraintOutputFile_ =
        getPrefix(info_->getFinalConfigFileName()) + ".constraintForces";

    // create ConstraintWriter
    constraintWriter_ =
        new ConstraintWriter(info_, constraintOutputFile_.c_str());

    if (!constraintWriter_) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "Failed to create ConstraintWriter\n");
      painCave.isFatal = 1;
      simError();
    }
  }